

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

double array_min(double *array,int N)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = *array;
  if (1 < N) {
    uVar1 = 1;
    dVar3 = dVar2;
    do {
      dVar2 = array[uVar1];
      if (dVar3 <= array[uVar1]) {
        dVar2 = dVar3;
      }
      uVar1 = uVar1 + 1;
      dVar3 = dVar2;
    } while ((uint)N != uVar1);
  }
  return dVar2;
}

Assistant:

double array_min(double *array,int N) {
	int i;
	double m = array[0];
	for (i = 1; i < N;++i) {
		if (array[i] < m ) {
			m = array[i];
			}
	}

	return m;
}